

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

ssize_t inbound_frame_effective_readlen
                  (nghttp2_inbound_frame *iframe,size_t payloadleft,size_t readlen)

{
  size_t sVar1;
  size_t padlen;
  size_t trail_padlen;
  size_t readlen_local;
  size_t payloadleft_local;
  nghttp2_inbound_frame *iframe_local;
  
  sVar1 = nghttp2_frame_trail_padlen(&iframe->frame,iframe->padlen);
  iframe_local = (nghttp2_inbound_frame *)readlen;
  if (payloadleft < sVar1) {
    if (readlen < sVar1 - payloadleft) {
      iframe_local = (nghttp2_inbound_frame *)0xffffffffffffffff;
    }
    else {
      iframe_local = (nghttp2_inbound_frame *)(readlen - (sVar1 - payloadleft));
    }
  }
  return (ssize_t)iframe_local;
}

Assistant:

static ssize_t inbound_frame_effective_readlen(nghttp2_inbound_frame *iframe,
                                               size_t payloadleft,
                                               size_t readlen) {
  size_t trail_padlen =
      nghttp2_frame_trail_padlen(&iframe->frame, iframe->padlen);

  if (trail_padlen > payloadleft) {
    size_t padlen;
    padlen = trail_padlen - payloadleft;
    if (readlen < padlen) {
      return -1;
    }
    return (ssize_t)(readlen - padlen);
  }
  return (ssize_t)(readlen);
}